

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

double mpack_expect_double(mpack_reader_t *reader)

{
  mpack_type_t mVar1;
  undefined1 auVar2 [16];
  mpack_tag_t mVar3;
  mpack_tag_t var;
  mpack_reader_t *reader_local;
  
  mVar3 = mpack_read_tag(reader);
  reader_local = (mpack_reader_t *)mVar3.v;
  mVar1 = mVar3.type;
  if (mVar1 == mpack_type_uint) {
    auVar2._8_4_ = mVar3.v._4_4_;
    auVar2._0_8_ = reader_local;
    auVar2._12_4_ = 0x45300000;
    reader_local = (mpack_reader_t *)
                   ((auVar2._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,mVar3.v._0_4_) - 4503599627370496.0));
  }
  else if (mVar1 == mpack_type_int) {
    reader_local = (mpack_reader_t *)(double)(long)reader_local;
  }
  else if (mVar1 == mpack_type_float) {
    reader_local = (mpack_reader_t *)(double)mVar3.v._0_4_;
  }
  else if (mVar1 != mpack_type_double) {
    mpack_reader_flag_error(reader,mpack_error_type);
    reader_local = (mpack_reader_t *)0x0;
  }
  return (double)reader_local;
}

Assistant:

double mpack_expect_double(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint)
        return (double)var.v.u;
    else if (var.type == mpack_type_int)
        return (double)var.v.i;
    else if (var.type == mpack_type_float)
        return (double)var.v.f;
    else if (var.type == mpack_type_double)
        return var.v.d;
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0.0;
}